

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::_alloc
          (array_n<char,_3,_std::allocator<char>_> *this,uint n)

{
  pointer pcVar1;
  ulong uVar2;
  
  if (n == 0) {
    pcVar1 = (pointer)0x0;
  }
  else {
    pcVar1 = (pointer)operator_new((ulong)n);
    this->first = pcVar1;
    uVar2 = 0;
    do {
      this->first[uVar2] = '\0';
      uVar2 = uVar2 + 1;
    } while (n != uVar2);
    pcVar1 = this->first;
    this->last = pcVar1 + uVar2;
  }
  this->_array = pcVar1;
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }